

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O2

void soul::heart::Checker::checkConnections(Program *program)

{
  EndpointType EVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  Module *pMVar5;
  ProcessorInstance *pPVar6;
  IODeclaration *pIVar7;
  IODeclaration *destInput_00;
  pointer ppVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  pointer ppVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar10;
  Connection *pCVar11;
  bool bVar12;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  pool_ptr<soul::heart::IODeclaration> sourceOutput;
  pool_ptr<soul::heart::ProcessorInstance> sourceProcessor;
  pool_ptr<soul::heart::IODeclaration> destInput;
  pool_ptr<soul::Module> sourceModule;
  ulong local_320;
  undefined1 local_310 [32];
  string destDescription;
  string sourceDescription;
  ProgramImpl *local_2a0;
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [64];
  CompileMessage local_228;
  CompileMessage local_1f0;
  CompileMessage local_1b8;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  ppVar8 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar8 == ppVar2) {
      return;
    }
    pMVar5 = ppVar8->object;
    if (pMVar5->moduleType == graphModule) {
      ppVar3 = (pMVar5->connections).
               super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar9 = (pMVar5->connections).
                    super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar3; ppVar9 = ppVar9 + 1
          ) {
        sourceOutput.object = (IODeclaration *)0x0;
        destInput.object = (IODeclaration *)0x0;
        std::__cxx11::string::string
                  ((string *)&sourceDescription,(string *)&(ppVar9->object->source).endpointName);
        std::__cxx11::string::string
                  ((string *)&destDescription,(string *)&(ppVar9->object->dest).endpointName);
        pCVar11 = ppVar9->object;
        if ((pCVar11->delayLength).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged == true) {
          uVar10 = (pCVar11->delayLength).super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload._M_value;
          if ((long)uVar10 < 1) {
            Errors::delayLineTooShort<>();
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_68);
          }
          if (0x40000 < uVar10) {
            Errors::delayLineTooLong<>();
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_a0);
          }
        }
        sourceProcessor.object = (pCVar11->source).processor.object;
        if (sourceProcessor.object == (ProcessorInstance *)0x0) {
          name_00._M_str = (char *)(ppVar9->object->source).endpointName._M_string_length;
          name_00._M_len = (size_t)ppVar8->object;
          Module::findInput((Module *)(local_298 + 8),name_00);
          sourceOutput.object = (IODeclaration *)local_298._8_8_;
          bVar4 = false;
          local_320 = 1;
        }
        else {
          pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
          Program::findModuleWithName((Program *)&sourceModule,(string *)program);
          if (sourceModule.object == (Module *)0x0) {
            pCVar11 = ppVar9->object;
            pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
            Errors::cannotFindProcessor<std::__cxx11::string&>
                      (&local_d8,(Errors *)&pPVar6->sourceName,args_00);
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_d8);
          }
          pMVar5 = pool_ptr<soul::Module>::operator->(&sourceModule);
          name._M_str = (char *)(ppVar9->object->source).endpointName._M_string_length;
          name._M_len = (size_t)pMVar5;
          Module::findOutput((Module *)local_268,name);
          sourceOutput.object = (IODeclaration *)local_268._0_8_;
          local_320 = 1;
          if ((ppVar9->object->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>
              ._M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
            local_320 = (ulong)pPVar6->arraySize;
          }
          pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
          std::operator+(&local_288,&pPVar6->instanceName,".");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310,&local_288,&sourceDescription);
          std::__cxx11::string::operator=((string *)&sourceDescription,(string *)local_310);
          std::__cxx11::string::~string((string *)local_310);
          std::__cxx11::string::~string((string *)&local_288);
          if (sourceOutput.object == (IODeclaration *)0x0) {
            pMVar5 = pool_ptr<soul::Module>::operator->(&sourceModule);
            name_01._M_str = (char *)(ppVar9->object->source).endpointName._M_string_length;
            name_01._M_len = (size_t)pMVar5;
            Module::findInput((Module *)local_310,name_01);
            bVar4 = (pointer)local_310._0_8_ != (pointer)0x0;
          }
          else {
            bVar4 = false;
          }
        }
        sourceProcessor.object = (ppVar9->object->dest).processor.object;
        if (sourceProcessor.object == (ProcessorInstance *)0x0) {
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ppVar9->object->dest).endpointName._M_dataplus._M_p;
          name_03._M_str = (char *)(ppVar9->object->dest).endpointName._M_string_length;
          name_03._M_len = (size_t)ppVar8->object;
          Module::findOutput((Module *)&stack0xfffffffffffffd60,name_03);
          destInput.object = (IODeclaration *)local_2a0;
          bVar12 = false;
          uVar10 = 1;
          args = extraout_RDX_00;
        }
        else {
          pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
          Program::findModuleWithName((Program *)&sourceModule,(string *)program);
          if (sourceModule.object == (Module *)0x0) {
            pCVar11 = ppVar9->object;
            pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
            Errors::cannotFindProcessor<std::__cxx11::string&>
                      (&local_110,(Errors *)&pPVar6->sourceName,args_01);
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_110);
          }
          pMVar5 = pool_ptr<soul::Module>::operator->(&sourceModule);
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ppVar9->object->dest).endpointName._M_dataplus._M_p;
          name_02._M_str = (char *)(ppVar9->object->dest).endpointName._M_string_length;
          name_02._M_len = (size_t)pMVar5;
          Module::findInput((Module *)local_298,name_02);
          destInput.object = (IODeclaration *)local_298._0_8_;
          uVar10 = 1;
          if ((ppVar9->object->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
              _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
            uVar10 = (ulong)pPVar6->arraySize;
          }
          pPVar6 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&sourceProcessor);
          std::operator+(&local_288,&pPVar6->instanceName,".");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310,&local_288,&destDescription);
          std::__cxx11::string::operator=((string *)&destDescription,(string *)local_310);
          std::__cxx11::string::~string((string *)local_310);
          std::__cxx11::string::~string((string *)&local_288);
          if (destInput.object == (IODeclaration *)0x0) {
            pMVar5 = pool_ptr<soul::Module>::operator->(&sourceModule);
            args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ppVar9->object->dest).endpointName._M_dataplus._M_p;
            name_04._M_str = (char *)(ppVar9->object->dest).endpointName._M_string_length;
            name_04._M_len = (size_t)pMVar5;
            Module::findOutput((Module *)local_310,name_04);
            bVar12 = (pointer)local_310._0_8_ != (pointer)0x0;
            args = extraout_RDX_01;
          }
          else {
            bVar12 = false;
            args = extraout_RDX;
          }
        }
        if (sourceOutput.object == (IODeclaration *)0x0) {
          pCVar11 = ppVar9->object;
          if (bVar4) {
            Errors::cannotConnectFromAnInput<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_228,(Errors *)&sourceDescription,&destDescription,args_1);
          }
          else {
            Errors::cannotFindSource<std::__cxx11::string&>
                      (&local_228,(Errors *)&sourceDescription,args);
          }
          CodeLocation::throwError(&(pCVar11->super_Object).location,&local_228);
        }
        pCVar11 = ppVar9->object;
        if (destInput.object == (IODeclaration *)0x0) {
          if (bVar12) {
            Errors::cannotConnectToAnOutput<std::__cxx11::string&,std::__cxx11::string&>
                      ((CompileMessage *)(local_268 + 8),(Errors *)&sourceDescription,
                       &destDescription,args_1);
          }
          else {
            Errors::cannotFindDestination<std::__cxx11::string&>
                      ((CompileMessage *)(local_268 + 8),(Errors *)&destDescription,args);
          }
          CodeLocation::throwError
                    (&(pCVar11->super_Object).location,(CompileMessage *)(local_268 + 8));
        }
        if ((pCVar11->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
            _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&sourceOutput);
          pCVar11 = ppVar9->object;
          if (((pIVar7->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
             (((pCVar11->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == true &&
              ((ulong)(pIVar7->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload._M_value <=
               (pCVar11->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value)))) {
            Errors::sourceEndpointIndexOutOfRange<>();
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_148);
          }
        }
        if ((pCVar11->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload
            .super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          pCVar11 = ppVar9->object;
          if (((pIVar7->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
             (((pCVar11->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == true &&
              ((ulong)(pIVar7->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload._M_value <=
               (pCVar11->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value)))) {
            Errors::destinationEndpointIndexOutOfRange<>();
            CodeLocation::throwError(&(pCVar11->super_Object).location,&local_180);
          }
        }
        pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&sourceOutput);
        EVar1 = pIVar7->endpointType;
        pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
        if (EVar1 != pIVar7->endpointType) {
          pCVar11 = ppVar9->object;
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&sourceOutput);
          local_310._0_8_ = getEndpointTypeName(pIVar7->endpointType);
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          local_288._M_dataplus._M_p = getEndpointTypeName(pIVar7->endpointType);
          Errors::cannotConnect<std::__cxx11::string&,char_const*,std::__cxx11::string&,char_const*>
                    (&local_1b8,(Errors *)&sourceDescription,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                     (char **)&destDescription,&local_288,(char **)in_R9);
          CodeLocation::throwError(&(pCVar11->super_Object).location,&local_1b8);
        }
        pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&sourceOutput);
        EVar1 = pIVar7->endpointType;
        pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator*(&sourceOutput);
        destInput_00 = pool_ptr<soul::heart::IODeclaration>::operator*(&destInput);
        bVar4 = areConnectionTypesCompatible(EVar1 == event,pIVar7,local_320,destInput_00,uVar10);
        if (!bVar4) {
          pCVar11 = ppVar9->object;
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&sourceOutput);
          IODeclaration::getTypesDescription_abi_cxx11_((string *)local_310,pIVar7);
          pIVar7 = pool_ptr<soul::heart::IODeclaration>::operator->(&destInput);
          IODeclaration::getTypesDescription_abi_cxx11_(&local_288,pIVar7);
          Errors::
          cannotConnect<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
                    (&local_1f0,(Errors *)&sourceDescription,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                     &destDescription,&local_288,in_R9);
          CodeLocation::throwError(&(pCVar11->super_Object).location,&local_1f0);
        }
        std::__cxx11::string::~string((string *)&destDescription);
        std::__cxx11::string::~string((string *)&sourceDescription);
      }
    }
    ppVar8 = ppVar8 + 1;
  } while( true );
}

Assistant:

static void checkConnections (const Program& program)
    {
        for (auto& m : program.getModules())
        {
            if (m->isGraph())
            {
                for (auto& conn : m->connections)
                {
                    pool_ptr<heart::IODeclaration> sourceOutput, destInput;
                    bool sourceWasAnInput = false, destWasAnOutput = false;
                    size_t sourceInstanceArraySize = 1, destInstanceArraySize = 1;
                    auto sourceDescription = conn->source.endpointName;
                    auto destDescription   = conn->dest.endpointName;

                    if (conn->delayLength)
                    {
                        if (conn->delayLength < 1)
                            conn->location.throwError (Errors::delayLineTooShort());

                        if (conn->delayLength > (int32_t) AST::maxDelayLineLength)
                            conn->location.throwError (Errors::delayLineTooLong());
                    }

                    if (auto sourceProcessor = conn->source.processor)
                    {
                        auto sourceModule = program.findModuleWithName (sourceProcessor->sourceName);

                        if (sourceModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (sourceProcessor->sourceName));

                        sourceOutput = sourceModule->findOutput (conn->source.endpointName);
                        sourceInstanceArraySize = conn->source.endpointIndex.has_value() ? 1 : sourceProcessor->arraySize;
                        sourceDescription = sourceProcessor->instanceName + "." + sourceDescription;

                        if (sourceOutput == nullptr)
                            sourceWasAnInput = sourceModule->findInput (conn->source.endpointName) != nullptr;
                    }
                    else
                    {
                        sourceOutput = m->findInput (conn->source.endpointName);
                    }

                    if (auto destProcessor = conn->dest.processor)
                    {
                        auto destModule = program.findModuleWithName (destProcessor->sourceName);

                        if (destModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (destProcessor->sourceName));

                        destInput = destModule->findInput (conn->dest.endpointName);
                        destInstanceArraySize = conn->dest.endpointIndex.has_value() ? 1 : destProcessor->arraySize;
                        destDescription = destProcessor->instanceName + "." + destDescription;

                        if (destInput == nullptr)
                            destWasAnOutput = destModule->findOutput (conn->dest.endpointName) != nullptr;
                    }
                    else
                    {
                        destInput = m->findOutput (conn->dest.endpointName);
                    }

                    if (sourceOutput == nullptr)
                        conn->location.throwError (sourceWasAnInput ? Errors::cannotConnectFromAnInput (sourceDescription, destDescription)
                                                                    : Errors::cannotFindSource (sourceDescription));

                    if (destInput == nullptr)
                        conn->location.throwError (destWasAnOutput ? Errors::cannotConnectToAnOutput (sourceDescription, destDescription)
                                                                   : Errors::cannotFindDestination (destDescription));

                    if (conn->source.endpointIndex && sourceOutput->arraySize <= conn->source.endpointIndex)
                        conn->location.throwError (Errors::sourceEndpointIndexOutOfRange());

                    if (conn->dest.endpointIndex && destInput->arraySize <= conn->dest.endpointIndex)
                        conn->location.throwError (Errors::destinationEndpointIndexOutOfRange());

                    if (sourceOutput->endpointType != destInput->endpointType)
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, getEndpointTypeName (sourceOutput->endpointType),
                                                                          destDescription, getEndpointTypeName (destInput->endpointType)));

                    if (! areConnectionTypesCompatible (sourceOutput->isEventEndpoint(),
                                                        *sourceOutput,
                                                        sourceInstanceArraySize,
                                                        *destInput,
                                                        destInstanceArraySize))
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, sourceOutput->getTypesDescription(),
                                                                          destDescription, destInput->getTypesDescription()));
                }
            }
        }
    }